

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O2

void __thiscall VmaBlockMetadata_TLSF::InsertFreeBlock(VmaBlockMetadata_TLSF *this,Block *block)

{
  ulong size;
  long lVar1;
  uint16_t secondIndex;
  uint32_t uVar2;
  byte memoryClass;
  
  size = block->size;
  lVar1 = 0x3f;
  if (size != 0) {
    for (; size >> lVar1 == 0; lVar1 = lVar1 + -1) {
    }
  }
  memoryClass = 0x38 - ((byte)lVar1 ^ 0x3f);
  if (size < 0x101) {
    memoryClass = 0;
  }
  secondIndex = SizeToSecondIndex(this,size,memoryClass);
  uVar2 = GetListIndex(this,memoryClass,secondIndex);
  block->prevFree = (Block *)0x0;
  block->field_5 =
       *(anon_union_8_2_34c73d97_for_Block_5 *)((long)this->m_FreeList + (ulong)(uVar2 << 3));
  *(Block **)((long)this->m_FreeList + (ulong)(uVar2 << 3)) = block;
  if ((block->field_5).nextFree == (Block *)0x0) {
    this->m_InnerIsFreeBitmap[memoryClass] =
         this->m_InnerIsFreeBitmap[memoryClass] | 1 << ((byte)secondIndex & 0x1f);
    this->m_IsFreeBitmap = this->m_IsFreeBitmap | (uint)(1L << (memoryClass & 0x3f));
  }
  else {
    ((block->field_5).nextFree)->prevFree = block;
  }
  this->m_BlocksFreeCount = this->m_BlocksFreeCount + 1;
  this->m_BlocksFreeSize = size + this->m_BlocksFreeSize;
  return;
}

Assistant:

void VmaBlockMetadata_TLSF::InsertFreeBlock(Block* block)
{
    VMA_ASSERT(block != m_NullBlock);
    VMA_ASSERT(!block->IsFree() && "Cannot insert block twice!");

    uint8_t memClass = SizeToMemoryClass(block->size);
    uint16_t secondIndex = SizeToSecondIndex(block->size, memClass);
    uint32_t index = GetListIndex(memClass, secondIndex);
    VMA_ASSERT(index < m_ListsCount);
    block->PrevFree() = VMA_NULL;
    block->NextFree() = m_FreeList[index];
    m_FreeList[index] = block;
    if (block->NextFree() != VMA_NULL)
        block->NextFree()->PrevFree() = block;
    else
    {
        m_InnerIsFreeBitmap[memClass] |= 1U << secondIndex;
        m_IsFreeBitmap |= 1UL << memClass;
    }
    ++m_BlocksFreeCount;
    m_BlocksFreeSize += block->size;
}